

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  VtabCtx *pVVar1;
  Table *pTVar2;
  Table *pTVar3;
  Index *pIVar4;
  char *p;
  int iVar5;
  Table *pNew;
  Parse *pParse;
  char *zFormat;
  uint rc;
  char *zErr;
  
  zErr = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pVVar1 = db->pVtabCtx;
  if ((pVVar1 != (VtabCtx *)0x0) && (pVVar1->bDeclared == 0)) {
    pTVar2 = pVVar1->pTab;
    pParse = (Parse *)sqlite3DbMallocZero(db,0x250);
    if (pParse == (Parse *)0x0) {
      rc = 7;
    }
    else {
      pParse->declareVtab = '\x01';
      pParse->db = db;
      pParse->nQueryLoop = 1;
      iVar5 = sqlite3RunParser(pParse,zCreateTable,&zErr);
      p = zErr;
      if ((((iVar5 == 0) && (pTVar3 = pParse->pNewTable, pTVar3 != (Table *)0x0)) &&
          (db->mallocFailed == '\0')) &&
         ((pTVar3->pSelect == (Select *)0x0 && (pTVar3->nModuleArg == 0)))) {
        rc = 0;
        if (pTVar2->aCol == (Column *)0x0) {
          pTVar2->aCol = pTVar3->aCol;
          pTVar2->nCol = pTVar3->nCol;
          pTVar2->tabFlags = pTVar2->tabFlags | pTVar3->tabFlags & 0x60;
          pTVar3->nCol = 0;
          pTVar3->aCol = (Column *)0x0;
          rc = 0;
          if ((pTVar3->tabFlags & 0x20) != 0) {
            rc = (uint)(pVVar1->pVTable->pMod->pModule->xUpdate !=
                       (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0
                       );
          }
          pIVar4 = pTVar3->pIndex;
          if (pIVar4 != (Index *)0x0) {
            pTVar2->pIndex = pIVar4;
            pTVar3->pIndex = (Index *)0x0;
            pIVar4->pTable = pTVar2;
          }
        }
        pVVar1->bDeclared = 1;
      }
      else {
        zFormat = "%s";
        if (zErr == (char *)0x0) {
          zFormat = (char *)0x0;
        }
        rc = 1;
        sqlite3ErrorWithMsg(db,1,zFormat,zErr);
        sqlite3DbFree(db,p);
      }
      pParse->declareVtab = '\0';
      if (pParse->pVdbe != (Vdbe *)0x0) {
        sqlite3VdbeFinalize(pParse->pVdbe);
      }
      sqlite3DeleteTable(db,pParse->pNewTable);
      sqlite3ParserReset(pParse);
      sqlite3DbFreeNN(db,pParse);
    }
    iVar5 = sqlite3ApiExit(db,rc);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar5;
  }
  sqlite3Error(db,0x15);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  iVar5 = sqlite3MisuseError(0x1ef2f);
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  Parse *pParse;
  int rc = SQLITE_OK;
  Table *pTab;
  char *zErr = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }
  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  pParse = sqlite3StackAllocZero(db, sizeof(*pParse));
  if( pParse==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }else{
    pParse->declareVtab = 1;
    pParse->db = db;
    pParse->nQueryLoop = 1;
  
    if( SQLITE_OK==sqlite3RunParser(pParse, zCreateTable, &zErr) 
     && pParse->pNewTable
     && !db->mallocFailed
     && !pParse->pNewTable->pSelect
     && !IsVirtual(pParse->pNewTable)
    ){
      if( !pTab->aCol ){
        Table *pNew = pParse->pNewTable;
        Index *pIdx;
        pTab->aCol = pNew->aCol;
        pTab->nCol = pNew->nCol;
        pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
        pNew->nCol = 0;
        pNew->aCol = 0;
        assert( pTab->pIndex==0 );
        if( !HasRowid(pNew) && pCtx->pVTable->pMod->pModule->xUpdate!=0 ){
          rc = SQLITE_ERROR;
        }
        pIdx = pNew->pIndex;
        if( pIdx ){
          assert( pIdx->pNext==0 );
          pTab->pIndex = pIdx;
          pNew->pIndex = 0;
          pIdx->pTable = pTab;
        }
      }
      pCtx->bDeclared = 1;
    }else{
      sqlite3ErrorWithMsg(db, SQLITE_ERROR, (zErr ? "%s" : 0), zErr);
      sqlite3DbFree(db, zErr);
      rc = SQLITE_ERROR;
    }
    pParse->declareVtab = 0;
  
    if( pParse->pVdbe ){
      sqlite3VdbeFinalize(pParse->pVdbe);
    }
    sqlite3DeleteTable(db, pParse->pNewTable);
    sqlite3ParserReset(pParse);
    sqlite3StackFree(db, pParse);
  }

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}